

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall TPZFrontNonSym<double>::Compress(TPZFrontNonSym<double> *this)

{
  long *plVar1;
  long *plVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> local_90;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_90);
  for (lVar11 = 0; lVar11 < (this->super_TPZFront<double>).fFront; lVar11 = lVar11 + 1) {
    if ((this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore[lVar11] != -1) {
      TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_90,lVar11);
    }
  }
  plVar1 = (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore;
  plVar2 = (this->super_TPZFront<double>).fLocal.fStore;
  lVar7 = 0;
  lVar11 = 0;
  if (0 < local_90.super_TPZVec<long>.fNElements) {
    lVar11 = local_90.super_TPZVec<long>.fNElements;
  }
  for (; lVar11 != lVar7; lVar7 = lVar7 + 1) {
    lVar6 = plVar1[local_90.super_TPZVec<long>.fStore[lVar7]];
    plVar1[lVar7] = lVar6;
    plVar2[lVar6] = lVar7;
  }
  plVar1 = (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore;
  for (lVar7 = lVar11; lVar7 < (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fNElements;
      lVar7 = lVar7 + 1) {
    plVar1[lVar7] = -1;
  }
  if ((this->super_TPZFront<double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
      + local_90.super_TPZVec<long>.fNElements != (this->super_TPZFront<double>).fFront) {
    std::operator<<((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n");
  }
  (this->super_TPZFront<double>).fFront = local_90.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize(&(this->super_TPZFront<double>).fFree.super_TPZManVector<int,_10>,0)
  ;
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<double>).fGlobal,(this->super_TPZFront<double>).fFront);
  if ((this->super_TPZFront<double>).fData.fNElements != 0) {
    lVar7 = 0;
    for (lVar6 = 0; lVar6 != lVar11; lVar6 = lVar6 + 1) {
      lVar8 = (long)(this->super_TPZFront<double>).fMaxFront;
      pdVar3 = (this->super_TPZFront<double>).fData.fStore;
      for (lVar9 = 0; local_90.super_TPZVec<long>.fNElements != lVar9; lVar9 = lVar9 + 1) {
        lVar4 = local_90.super_TPZVec<long>.fStore[lVar9];
        lVar5 = local_90.super_TPZVec<long>.fStore[lVar6];
        lVar10 = lVar5 * lVar8;
        *(double *)((long)pdVar3 + lVar9 * 8 + lVar7 * lVar8) = pdVar3[lVar10 + lVar4];
        if ((lVar9 != lVar4) || (lVar5 != lVar6)) {
          pdVar3[lVar10 + lVar4] = 0.0;
        }
      }
      lVar7 = lVar7 + 8;
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&local_90);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress");
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//this->fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i < nfound; i++){
			Element(i,j) = Element(from[i], from[j]);
			if(from[i]!=i || from[j]!=j) Element(from[i],from[j])=0.;
		}
	}
}